

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(cmGlobalGhsMultiGenerator *this,cmake *cm)

{
  cmState *this_00;
  cmake *cm_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  cmGlobalGenerator::cmGlobalGenerator(&this->super_cmGlobalGenerator,cm);
  (this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalGhsMultiGenerator_011c5340;
  std::__cxx11::string::string((string *)&this->StampFile);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (&this->ProjectTargets);
  this_00 = cmake::GetState(cm);
  cmState::SetGhsMultiIDE(this_00,true);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(cmake* cm)
  : cmGlobalGenerator(cm)
{
  cm->GetState()->SetGhsMultiIDE(true);
}